

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Bool prvTidyFindNodeWithId(Node *node,TidyTagId tid)

{
  Bool BVar1;
  
  if (node != (Node *)0x0) {
    do {
      if (((node->tag != (Dict *)0x0) && (node->tag->id == tid)) ||
         ((node->content != (Node *)0x0 &&
          (BVar1 = prvTidyFindNodeWithId(node->content,tid), BVar1 != no)))) {
        return yes;
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return no;
}

Assistant:

Bool TY_(FindNodeWithId)( Node *node, TidyTagId tid )
{
    Node *content;
    while (node)
    {
        if (TagIsId(node,tid))
            return yes;
        /*\ 
         *   Issue #459 - Under certain circumstances, with many node this use of
         *   'for (content = node->content; content; content = content->content)'
         *   would produce a **forever** circle, or at least a very extended loop...
         *   It is sufficient to test the content, if it exists,
         *   to quickly iterate all nodes. Now all nodes are tested only once.
        \*/ 
        content = node->content;
        if (content)
        {
            if (TY_(FindNodeWithId)(content,tid))
                return yes;
        }
        node = node->next;
    }
    return no;
}